

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenInitializer::InfoWriter::ListJoin<std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (string *__return_storage_ptr__,InfoWriter *this,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          it_begin,_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   it_end)

{
  char cVar1;
  _Rb_tree_node_base *p_Var2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  p_Var2 = (_Rb_tree_node_base *)this;
LAB_002c6350:
  if (p_Var2 == it_begin._M_node) {
    return __return_storage_ptr__;
  }
  if (p_Var2 != (_Rb_tree_node_base *)this) {
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
  }
  pcVar3 = *(char **)(p_Var2 + 1);
  do {
    cVar1 = *pcVar3;
    if ((((cVar1 == '\"') || (cVar1 == '$')) || (cVar1 == ';')) || (cVar1 == '\\')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      if (cVar1 == '\0') break;
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    pcVar3 = pcVar3 + 1;
  } while( true );
  p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  goto LAB_002c6350;
}

Assistant:

std::string cmQtAutoGenInitializer::InfoWriter::ListJoin(IT it_begin,
                                                         IT it_end)
{
  std::string res;
  for (IT it = it_begin; it != it_end; ++it) {
    if (it != it_begin) {
      res += ';';
    }
    for (const char* c = it->c_str(); *c; ++c) {
      if (*c == '"') {
        // Escape the double quote to avoid ending the argument.
        res += "\\\"";
      } else if (*c == '$') {
        // Escape the dollar to avoid expanding variables.
        res += "\\$";
      } else if (*c == '\\') {
        // Escape the backslash to avoid other escapes.
        res += "\\\\";
      } else if (*c == ';') {
        // Escape the semicolon to avoid list expansion.
        res += "\\;";
      } else {
        // Other characters will be parsed correctly.
        res += *c;
      }
    }
  }
  return res;
}